

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a4_aux.c
# Opt level: O2

void matrix_mul_f(MATRIX_f *m1,MATRIX_f *m2,MATRIX_f *out)

{
  float (*pafVar1) [3];
  float *pfVar2;
  MATRIX_f *pMVar3;
  MATRIX_f *pMVar4;
  float (*pafVar5) [3];
  long lVar6;
  MATRIX_f *pMVar7;
  float *pfVar8;
  long lVar9;
  MATRIX_f local_48;
  
  pMVar3 = m2;
  if (m1 == out) {
    pfVar2 = local_48.t;
    pafVar1 = local_48.v + 2;
    pMVar4 = &local_48;
    pafVar5 = local_48.v + 1;
    m2 = m1;
  }
  else {
    pafVar1 = m1->v + 2;
    pafVar5 = m1->v + 1;
    pfVar2 = m1->t;
    pMVar4 = m1;
    if (m2 != out) goto LAB_0010616f;
    pMVar3 = &local_48;
  }
  local_48._32_8_ = *(undefined8 *)(m2->v[2] + 2);
  local_48.t._4_8_ = *(undefined8 *)(m2->t + 1);
  local_48.v[1]._4_8_ = *(undefined8 *)(m2->v[1] + 1);
  local_48.v[2]._0_8_ = *(undefined8 *)m2->v[2];
  local_48.v[0]._0_8_ = *(undefined8 *)m2->v[0];
  local_48.v._8_8_ = *(undefined8 *)(m2->v[0] + 2);
LAB_0010616f:
  pMVar7 = out;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    pfVar8 = pMVar3->v[lVar6] + 1;
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      pMVar7->v[0][lVar9] =
           (*pafVar1)[lVar9] * pMVar3->v[lVar6][2] +
           pMVar4->v[0][lVar9] * pMVar3->v[lVar6][0] + (*pafVar5)[lVar9] * *pfVar8;
    }
    out->t[lVar6] =
         pfVar2[2] * pMVar3->v[lVar6][2] + *pfVar2 * pMVar3->v[lVar6][0] + pfVar2[1] * *pfVar8 +
         pMVar3->t[lVar6];
    pMVar7 = (MATRIX_f *)(pMVar7->v + 1);
  }
  return;
}

Assistant:

void matrix_mul_f(const MATRIX_f *m1, const MATRIX_f *m2, MATRIX_f *out)
{
   MATRIX_f temp;
   int i, j;

   if (m1 == out) {
      temp = *m1;
      m1 = &temp;
   }
   else if (m2 == out) {
      temp = *m2;
      m2 = &temp;
   }

   for (i=0; i<3; i++) {
      for (j=0; j<3; j++) {
	 out->v[i][j] = (m1->v[0][j] * m2->v[i][0]) +
			(m1->v[1][j] * m2->v[i][1]) +
			(m1->v[2][j] * m2->v[i][2]);
      }

      out->t[i] = (m1->t[0] * m2->v[i][0]) +
		  (m1->t[1] * m2->v[i][1]) +
		  (m1->t[2] * m2->v[i][2]) +
		  m2->t[i];
   }
}